

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O2

void __thiscall Liby::UdpConnection::destroy(UdpConnection *this)

{
  UdpSocket *pUVar1;
  Endpoint EStack_18;
  
  pUVar1 = this->socket_;
  if (pUVar1 != (UdpSocket *)0x0) {
    Endpoint::Endpoint(&EStack_18,&this->peer_);
    std::
    _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
    ::erase(&(pUVar1->conns_)._M_t,&EStack_18);
    return;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,0x3a,"void Liby::UdpConnection::destroy()");
}

Assistant:

void UdpConnection::destroy() {
    assert(socket_);
    socket_->destroyConn(Endpoint(&peer_));
}